

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O2

int fixAtomName(char *atomname,char *resname,int position)

{
  char cVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  long lVar4;
  char name [5];
  char resn [6];
  
  builtin_strncpy(name,"    ",5);
  sprintf(resn,":%-3.3s:",resname);
  for (lVar4 = 0; (lVar4 != 4 && (cVar1 = atomname[lVar4], (long)cVar1 != 0)); lVar4 = lVar4 + 1) {
    pp_Var2 = __ctype_toupper_loc();
    name[lVar4] = (char)(*pp_Var2)[cVar1];
  }
  name[lVar4] = '\0';
  cVar1 = name[position];
  if (cVar1 == 'S') goto LAB_0011fa95;
  if (cVar1 == 'F') {
LAB_0011fa53:
    pcVar3 = strstr(":PHF:HF3:HF5:",resn);
    if (pcVar3 != (char *)0x0) {
      return 1;
    }
LAB_0011fa69:
    pcVar3 = strstr(": HG:HG2:HGB:HGC:HGI:MAC:MBO:MMC:PHG:PMB:AAS:AMS:BE7:CMH:EMC:EMT:",resn);
    if (pcVar3 != (char *)0x0) {
      return 1;
    }
  }
  else {
    if (cVar1 == 'G') goto LAB_0011fa69;
    if (cVar1 != 'O') {
      if (cVar1 != 'E') {
        return 0;
      }
      pcVar3 = strstr("currently there are none RMI 070711",resn);
      if (pcVar3 != (char *)0x0) {
        return 1;
      }
      goto LAB_0011fa53;
    }
  }
  pcVar3 = strstr(": HO:HO3:",resn);
  if (pcVar3 != (char *)0x0) {
    return 1;
  }
LAB_0011fa95:
  pcVar3 = strstr("currently there are none RMI 070711",resn);
  if (pcVar3 == (char *)0x0) {
    return 0;
  }
  return 1;
}

Assistant:

int fixAtomName(const char* atomname, char resname[], int position) { /* no bool in C */
   char resn[6];
   char name[5] = "    ";
   int i;
   sprintf(resn, ":%-3.3s:", resname);
   for (i = 0; i < 4; i++) { /* uppercase the input */
      if (atomname[i] == '\0') { break; }
      name[i] = toupper(atomname[i]);
   }
   name[i] = '\0';
        switch(name[position]) {
           case 'E': if (strstr(HE_RESNAMES, resn) != NULL) { return 1; }
           case 'F': if (strstr(HF_RESNAMES, resn) != NULL) { return 1; }
           case 'G': if (strstr(HG_RESNAMES, resn) != NULL) { return 1; }
           case 'O': if (strstr(HO_RESNAMES, resn) != NULL) { return 1; }
           case 'S': if (strstr(HS_RESNAMES, resn) != NULL) { return 1; }
           default: break;
	}
   return 0;
}